

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gridded_Data_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Gridded_Data_PDU::SetPDUNumberAndTotal(Gridded_Data_PDU *this,KUINT16 Num,KUINT16 Total)

{
  KException *this_00;
  allocator<char> local_39;
  KString local_38;
  KUINT16 local_14;
  KUINT16 local_12;
  KUINT16 Total_local;
  Gridded_Data_PDU *pGStack_10;
  KUINT16 Num_local;
  Gridded_Data_PDU *this_local;
  
  if (Total < Num) {
    local_14 = Total;
    local_12 = Num;
    pGStack_10 = this;
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"SetPDUNumberAndTotal",&local_39);
    KException::KException<char_const*>
              (this_00,&local_38,8,"PDU Number can not be greater than PDU Total");
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  this->m_ui16PDUNum = Num;
  this->m_ui16PDUTotal = Total;
  return;
}

Assistant:

void Gridded_Data_PDU::SetPDUNumberAndTotal(KUINT16 Num, KUINT16 Total) noexcept(false)
{
    if( Num > Total )throw KException( __FUNCTION__, INVALID_DATA, "PDU Number can not be greater than PDU Total" );
    m_ui16PDUNum = Num;
    m_ui16PDUTotal = Total;
}